

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O2

void __thiscall
duckdb::WindowBoundariesState::PeerBegin
          (WindowBoundariesState *this,DataChunk *bounds,idx_t row_idx,idx_t count,bool is_jump,
          ValidityMask *partition_mask,ValidityMask *order_mask)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  unsigned_long *puVar4;
  idx_t chunk_idx;
  reference pvVar5;
  idx_t iVar6;
  long lVar7;
  idx_t n;
  
  pvVar5 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,2);
  pdVar2 = pvVar5->data;
  if (this->partition_count + this->order_count == 0) {
    for (iVar6 = 0; count != iVar6; iVar6 = iVar6 + 1) {
      pdVar1 = pdVar2 + iVar6 * 8;
      pdVar1[0] = '\0';
      pdVar1[1] = '\0';
      pdVar1[2] = '\0';
      pdVar1[3] = '\0';
      pdVar1[4] = '\0';
      pdVar1[5] = '\0';
      pdVar1[6] = '\0';
      pdVar1[7] = '\0';
    }
  }
  else {
    puVar3 = (partition_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    puVar4 = (order_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    for (lVar7 = 1; lVar7 - count != 1; lVar7 = lVar7 + 1) {
      iVar6 = row_idx;
      if ((puVar3[row_idx >> 6] >> (row_idx & 0x3f) & 1) == 0) {
        if ((is_jump & 1U) != 0) goto LAB_015bdc7d;
        if ((puVar4[row_idx >> 6] & 1L << ((byte)row_idx & 0x3f)) == 0) {
          iVar6 = this->peer_start;
        }
        else {
          this->peer_start = row_idx;
        }
      }
      else if ((is_jump & 1U) == 0) {
        this->peer_start = row_idx;
        is_jump = false;
      }
      else {
LAB_015bdc7d:
        n = 1;
        iVar6 = FindPrevStart(order_mask,0,row_idx + 1,&n);
        is_jump = false;
        this->peer_start = iVar6;
      }
      *(idx_t *)(pdVar2 + lVar7 * 8 + -8) = iVar6;
      row_idx = row_idx + 1;
    }
  }
  return;
}

Assistant:

void WindowBoundariesState::PeerBegin(DataChunk &bounds, idx_t row_idx, const idx_t count, bool is_jump,
                                      const ValidityMask &partition_mask, const ValidityMask &order_mask) {

	auto peer_begin_data = FlatVector::GetData<idx_t>(bounds.data[PEER_BEGIN]);

	//	OVER()
	if (partition_count + order_count == 0) {
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			peer_begin_data[chunk_idx] = 0;
		}
		return;
	}

	for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
		// determine partition and peer group boundaries to ultimately figure out window size
		const auto is_same_partition = !partition_mask.RowIsValidUnsafe(row_idx);
		const auto is_peer = !order_mask.RowIsValidUnsafe(row_idx);

		// when the partition changes, recompute the boundaries
		if (!is_same_partition || is_jump) {
			// find end of partition
			if (is_jump) {
				idx_t n = 1;
				peer_start = FindPrevStart(order_mask, 0, row_idx + 1, n);
			} else {
				peer_start = row_idx;
			}
			is_jump = false;
		} else if (!is_peer) {
			peer_start = row_idx;
		}

		peer_begin_data[chunk_idx] = peer_start;
	}
}